

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::checkShortUnits(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  precise_unit pVar5;
  precise_unit retunit_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_1;
  precise_unit retunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  size_type fndPn;
  size_type fndM;
  size_type fndP;
  size_type fndNS;
  bool mod;
  char in_stack_0000043f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined1 *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined1 *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  string *in_stack_fffffffffffffed0;
  undefined1 local_120 [32];
  undefined1 local_100 [36];
  int local_dc;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_98;
  string *psStack_90;
  double local_78;
  string *psStack_70;
  size_type local_40;
  size_type local_38;
  size_type local_30;
  size_type local_28;
  byte local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  byte local_1;
  
  local_19 = 0;
  local_10 = in_RDI;
  local_28 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_not_of(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_30 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_38 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  if ((((local_30 == 2) &&
       (sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(local_10), 4 < sVar2)) &&
      (local_40 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find_first_not_of(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
      local_40 != 0xffffffffffffffff)) &&
     ((pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator[](in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18),
      *pvVar3 != '(' && (local_38 == 0xffffffffffffffff)))) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffe38,
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (size_type)in_stack_fffffffffffffe28);
    bVar1 = std::operator==(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pVar5 = get_unit(in_stack_fffffffffffffed0,
                       CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffed0 = pVar5._8_8_;
      local_78 = pVar5.multiplier_;
      psStack_70 = in_stack_fffffffffffffed0;
      in_stack_fffffffffffffecf =
           is_valid((precise_unit *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if ((bool)in_stack_fffffffffffffecf) {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
        *pvVar3 = '_';
        pVar5 = get_unit(in_stack_fffffffffffffed0,
                         CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        psStack_90 = pVar5._8_8_;
        local_98 = pVar5.multiplier_;
        local_78 = local_98;
        psStack_70 = psStack_90;
        bVar1 = is_valid((precise_unit *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        if (!bVar1) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
          *pvVar3 = '*';
        }
        local_30 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        local_19 = 1;
      }
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe20);
  }
  while (local_30 != 0xffffffffffffffff) {
    sVar2 = local_30 + 2;
    sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(local_10);
    if (sVar2 == sVar4) {
      if (local_38 == 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffe38,
                   CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (size_type)in_stack_fffffffffffffe28);
        pVar5 = get_unit(in_stack_fffffffffffffed0,
                         CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        uStack_c0 = pVar5._8_8_;
        local_c8 = pVar5.multiplier_;
        bVar1 = is_valid((precise_unit *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        if (bVar1) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
          *pvVar3 = '_';
          pVar5 = get_unit(in_stack_fffffffffffffed0,
                           CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
          uStack_d0 = pVar5._8_8_;
          local_d8 = pVar5.multiplier_;
          local_c8 = local_d8;
          uStack_c0 = uStack_d0;
          bVar1 = is_valid((precise_unit *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          if (!bVar1) {
            in_stack_fffffffffffffe50 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
            *(value_type *)&(in_stack_fffffffffffffe50->_M_dataplus)._M_p = '*';
          }
          local_1 = local_19 & 1;
          local_dc = 1;
        }
        else {
          local_dc = 0;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe20);
        if (local_dc != 0) goto LAB_006c67c1;
      }
      in_stack_fffffffffffffe40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_30 + 1);
      in_stack_fffffffffffffe38 = local_10;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator[](in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe48 = local_100;
      shortStringReplacement_abi_cxx11_(in_stack_0000043f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48,
                 (size_type)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
      local_19 = 1;
    }
    else {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe34 = (int)*pvVar3;
      if (((in_stack_fffffffffffffe34 == 0x20) || (in_stack_fffffffffffffe34 == 0x2a)) ||
         ((in_stack_fffffffffffffe34 - 0x2eU < 2 || (in_stack_fffffffffffffe34 == 0x5e)))) {
        in_stack_fffffffffffffe20 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_30 + 1);
        in_stack_fffffffffffffe18 = local_10;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator[](in_stack_fffffffffffffe20,(size_type)local_10);
        in_stack_fffffffffffffe28 = local_120;
        shortStringReplacement_abi_cxx11_(in_stack_0000043f);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace(in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48,
                (size_type)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe20);
        local_19 = 1;
      }
    }
    local_30 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_of(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  }
  local_1 = local_19 & 1;
LAB_006c67c1:
  return (bool)(local_1 & 1);
}

Assistant:

static bool checkShortUnits(std::string& unit_string, std::uint64_t match_flags)
{
    bool mod = false;
    auto fndNS = unit_string.find_first_not_of(" \t");
    auto fndP = unit_string.find_first_of(" \t", fndNS + 1);
    auto fndM = unit_string.find_first_of("*/");
    if (fndP == 2) {
        if (unit_string.size() > 4) {
            // the single character section next will catch 4 character string
            // issues
            auto fndPn = unit_string.find_first_not_of(" \t", fndP);

            if (fndPn != std::string::npos && unit_string[fndPn] != '(' &&
                fndM == std::string::npos) {
                auto str = unit_string.substr(0, 2);
                if (str != "fl") {
                    auto retunit = get_unit(str, match_flags);
                    if (is_valid(retunit)) {
                        unit_string[2] = '_';
                        retunit = get_unit(unit_string, match_flags);
                        if (!is_valid(retunit)) {
                            unit_string[2] = '*';
                        }
                        fndP = unit_string.find_first_of(" \t", 3);
                        mod = true;
                    }
                }
            }
        }
    }
    while (fndP != std::string::npos) {
        if (fndP + 2 == unit_string.size()) {
            // we are at the end of the string
            if (fndM == std::string::npos) {
                auto str = unit_string.substr(0, fndP);
                auto retunit = get_unit(str, match_flags);
                if (is_valid(retunit)) {
                    unit_string[fndP] = '_';
                    retunit = get_unit(unit_string, match_flags);
                    if (!is_valid(retunit)) {
                        unit_string[fndP] = '*';
                    }
                    return mod;
                }
            }
            unit_string.replace(
                fndP + 1, 1, shortStringReplacement(unit_string[fndP + 1]));
            mod = true;
        } else {
            switch (unit_string[fndP + 1]) {
                case ' ':
                case '*':
                case '/':
                case '^':
                case '.':
                    unit_string.replace(
                        fndP + 1,
                        1,
                        shortStringReplacement(unit_string[fndP + 1]));
                    mod = true;
                    break;
                default:
                    break;
            }
        }
        fndP = unit_string.find_first_of(" \t", fndP + 1);
    }
    return mod;
}